

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O1

void __thiscall
Privkey_HasWif_uncompressed_Test::~Privkey_HasWif_uncompressed_Test
          (Privkey_HasWif_uncompressed_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Privkey, HasWif_uncompressed) {
  std::string wif = "5JBb5A38fjjeBnngkvRmCsXN6EY4w8jWvckik3hDvYQMcddGY23";
  NetType net_type = NetType::kRegtest;
  bool is_compressed = false;
  bool has_wif = Privkey::HasWif(wif, &net_type, &is_compressed);
  EXPECT_TRUE(has_wif);
  EXPECT_FALSE(is_compressed);
  EXPECT_EQ(NetType::kMainnet, net_type);
}